

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ext_loader_impl.cpp
# Opt level: O2

int ext_loader_impl_clear(loader_impl impl,loader_handle handle)

{
  long lVar1;
  int iVar2;
  long lVar3;
  mapped_type *this;
  long lVar4;
  size_t i;
  ulong uVar5;
  
  lVar3 = loader_impl_get();
  if (handle == (loader_handle)0x0 || lVar3 == 0) {
    iVar2 = 1;
  }
  else {
    lVar4 = 0;
    uVar5 = 0;
    while( true ) {
      lVar1 = *handle;
      if ((ulong)((*(long *)((long)handle + 8) - lVar1) / 0x30) <= uVar5) break;
      log_write_impl_va("metacall",0x14c,"ext_loader_impl_clear",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loaders/ext_loader/source/ext_loader_impl.cpp"
                        ,0,"Storing handle: %s <%p> in destroy list",*(undefined8 *)(lVar1 + lVar4),
                        *(undefined8 *)(lVar1 + 0x20 + lVar4));
      lVar1 = *handle;
      this = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_loader_impl_ext_handle_lib_type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_loader_impl_ext_handle_lib_type>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_loader_impl_ext_handle_lib_type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_loader_impl_ext_handle_lib_type>_>_>
                           *)(lVar3 + 0x30),(key_type *)(lVar1 + lVar4));
      loader_impl_ext_handle_lib_type::operator=
                (this,(loader_impl_ext_handle_lib_type *)(lVar1 + lVar4));
      std::vector<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>
      ::erase((vector<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>
               *)handle,(loader_impl_ext_handle_lib_type *)(*handle + lVar4));
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x30;
    }
    std::vector<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>::
    ~vector((vector<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>
             *)handle);
    operator_delete(handle,0x18);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int ext_loader_impl_clear(loader_impl impl, loader_handle handle)
{
	loader_impl_ext ext_impl = static_cast<loader_impl_ext>(loader_impl_get(impl));

	if (ext_impl == NULL)
	{
		return 1;
	}

	loader_impl_ext_handle ext_handle = static_cast<loader_impl_ext_handle>(handle);

	if (ext_handle != NULL)
	{
		for (size_t i = 0; i < ext_handle->extensions.size(); i++)
		{
			log_write("metacall", LOG_LEVEL_DEBUG, "Storing handle: %s <%p> in destroy list", ext_handle->extensions[i].name.c_str(), ext_handle->extensions[i].handle);
			ext_impl->destroy_list[ext_handle->extensions[i].name] = ext_handle->extensions[i];
			ext_handle->extensions.erase(ext_handle->extensions.begin() + i);
		}

		delete ext_handle;

		return 0;
	}

	return 1;
}